

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.cpp
# Opt level: O2

void __thiscall
presolve::HighsPostsolveStack::SlackColSubstitution::undo
          (SlackColSubstitution *this,HighsOptions *options,
          vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
          *rowValues,HighsSolution *solution,HighsBasis *basis)

{
  double *pdVar1;
  HighsBasisStatus HVar2;
  int iVar3;
  int iVar4;
  pointer pdVar5;
  pointer pHVar6;
  bool bVar7;
  pointer pNVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double v;
  HighsCDouble HVar13;
  HighsCDouble local_48;
  HighsCDouble local_38;
  
  iVar3 = this->row;
  uVar9 = (long)(solution->row_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(solution->row_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  local_48.hi = 0.0;
  local_48.lo = 0.0;
  pdVar5 = (solution->col_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar10 = 0.0;
  dVar11 = 0.0;
  v = 0.0;
  for (pNVar8 = (rowValues->
                super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pNVar8 != (rowValues->
                super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                )._M_impl.super__Vector_impl_data._M_finish; pNVar8 = pNVar8 + 1) {
    dVar12 = pNVar8->value;
    if (pNVar8->index != this->col) {
      dVar12 = dVar12 * pdVar5[pNVar8->index];
      local_48.hi = dVar11 + dVar12;
      dVar10 = dVar10 + (dVar11 - (local_48.hi - dVar12)) +
                        (dVar12 - (local_48.hi - (local_48.hi - dVar12)));
      dVar11 = local_48.hi;
      dVar12 = v;
      local_48.lo = dVar10;
    }
    v = dVar12;
  }
  if ((ulong)(long)iVar3 < uVar9) {
    HVar13 = HighsCDouble::operator+(&local_48,pdVar5[this->col] * v);
    (solution->row_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[this->row] = HVar13.lo + HVar13.hi;
  }
  local_38 = operator-(this->rhs,&local_48);
  HVar13 = HighsCDouble::operator/(&local_38,v);
  iVar4 = this->col;
  (solution->col_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[iVar4] = HVar13.lo + HVar13.hi;
  if (solution->dual_valid == true) {
    if ((ulong)(long)iVar3 < uVar9) {
      iVar3 = this->row;
      pdVar5 = (solution->row_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      (solution->col_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[iVar4] = -pdVar5[iVar3] / v;
      if (basis->valid != false) {
        pHVar6 = (basis->row_status).
                 super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
                 super__Vector_impl_data._M_start;
        HVar2 = pHVar6[iVar3];
        if (HVar2 == kLower) {
          bVar7 = 0.0 < v;
        }
        else {
          if (HVar2 == kBasic) {
            (basis->col_status).
            super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
            super__Vector_impl_data._M_start[iVar4] = kBasic;
            pdVar1 = pdVar5 + iVar3;
            pHVar6[iVar3] = (*pdVar1 <= 0.0 && *pdVar1 != 0.0) * '\x02';
            return;
          }
          bVar7 = v <= 0.0;
        }
        (basis->col_status).super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
        _M_impl.super__Vector_impl_data._M_start[iVar4] = bVar7 * '\x02';
      }
    }
    else if (basis->valid != false) {
      (basis->col_status).super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
      _M_impl.super__Vector_impl_data._M_start[iVar4] = kNonbasic;
    }
  }
  return;
}

Assistant:

void HighsPostsolveStack::SlackColSubstitution::undo(
    const HighsOptions& options, const std::vector<Nonzero>& rowValues,
    HighsSolution& solution, HighsBasis& basis) {
  bool debug_print = false;
  // May have to determine row dual and basis status unless doing
  // primal-only transformation in MIP solver, in which case row may
  // no longer exist if it corresponds to a removed cut, so have to
  // avoid exceeding array bounds of solution.row_value
  bool isModelRow = static_cast<size_t>(row) < solution.row_value.size();

  // compute primal values
  double colCoef = 0;
  HighsCDouble rowValue = 0;
  for (const auto& rowVal : rowValues) {
    if (rowVal.index == col)
      colCoef = rowVal.value;
    else
      rowValue += rowVal.value * solution.col_value[rowVal.index];
  }

  assert(colCoef != 0);
  // Row values aren't fully postsolved, so why do this?
  if (isModelRow)
    solution.row_value[row] =
        double(rowValue + colCoef * solution.col_value[col]);

  solution.col_value[col] = double((rhs - rowValue) / colCoef);

  // If no dual values requested, return here
  if (!solution.dual_valid) return;

  // Row retains its dual value, and column has this dual value scaled by coeff
  if (isModelRow) solution.col_dual[col] = -solution.row_dual[row] / colCoef;

  // Set basis status if necessary
  if (!basis.valid) return;

  // If row is basic, then slack is basic, otherwise row retains its status
  if (isModelRow) {
    HighsBasisStatus save_row_basis_status = basis.row_status[row];
    if (basis.row_status[row] == HighsBasisStatus::kBasic) {
      basis.col_status[col] = HighsBasisStatus::kBasic;
      basis.row_status[row] =
          computeRowStatus(solution.row_dual[row], RowType::kEq);
    } else if (basis.row_status[row] == HighsBasisStatus::kLower) {
      basis.col_status[col] =
          colCoef > 0 ? HighsBasisStatus::kUpper : HighsBasisStatus::kLower;
    } else {
      basis.col_status[col] =
          colCoef > 0 ? HighsBasisStatus::kLower : HighsBasisStatus::kUpper;
    }
    if (debug_print)
      printf(
          "HighsPostsolveStack::SlackColSubstitution::undo OgRowStatus = %s; "
          "RowStatus = %s; ColStatus = %s\n",
          utilBasisStatusToString(save_row_basis_status).c_str(),
          utilBasisStatusToString(basis.row_status[row]).c_str(),
          utilBasisStatusToString(basis.col_status[col]).c_str());
    if (basis.col_status[col] == HighsBasisStatus::kLower) {
      assert(solution.col_dual[col] > -options.dual_feasibility_tolerance);
    } else if (basis.col_status[col] == HighsBasisStatus::kUpper) {
      assert(solution.col_dual[col] < options.dual_feasibility_tolerance);
    }
  } else {
    basis.col_status[col] = HighsBasisStatus::kNonbasic;
  }
}